

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropymode.c
# Opt level: O3

void av1_setup_past_independence(AV1_COMMON *cm)

{
  RefCntBuffer *pRVar1;
  
  av1_clearall_segfeatures(&cm->seg);
  pRVar1 = cm->cur_frame;
  if (pRVar1->seg_map != (uint8_t *)0x0) {
    memset(pRVar1->seg_map,0,(long)pRVar1->mi_cols * (long)pRVar1->mi_rows);
    pRVar1 = cm->cur_frame;
  }
  pRVar1->ref_deltas[0] = '\x01';
  pRVar1->ref_deltas[1] = '\0';
  pRVar1->ref_deltas[2] = '\0';
  pRVar1->ref_deltas[3] = '\0';
  pRVar1->ref_deltas[4] = -1;
  pRVar1->ref_deltas[5] = '\0';
  pRVar1->ref_deltas[6] = -1;
  pRVar1->ref_deltas[7] = -1;
  pRVar1 = cm->cur_frame;
  pRVar1->mode_deltas[0] = '\0';
  pRVar1->mode_deltas[1] = '\0';
  (cm->lf).mode_ref_delta_enabled = '\x01';
  (cm->lf).mode_ref_delta_update = '\x01';
  (cm->lf).ref_deltas[0] = '\x01';
  (cm->lf).ref_deltas[1] = '\0';
  (cm->lf).ref_deltas[2] = '\0';
  (cm->lf).ref_deltas[3] = '\0';
  (cm->lf).ref_deltas[4] = -1;
  (cm->lf).ref_deltas[5] = '\0';
  *(undefined4 *)((cm->lf).ref_deltas + 6) = 0xffff;
  av1_default_coef_probs(cm);
  av1_init_mode_probs(cm->fc);
  av1_init_mv_probs(cm);
  cm->fc->initialized = 1;
  av1_setup_frame_contexts(cm);
  return;
}

Assistant:

void av1_setup_past_independence(AV1_COMMON *cm) {
  // Reset the segment feature data to the default stats:
  // Features disabled, 0, with delta coding (Default state).
  av1_clearall_segfeatures(&cm->seg);

  if (cm->cur_frame->seg_map) {
    memset(cm->cur_frame->seg_map, 0,
           (cm->cur_frame->mi_rows * cm->cur_frame->mi_cols));
  }

  // reset mode ref deltas
  av1_set_default_ref_deltas(cm->cur_frame->ref_deltas);
  av1_set_default_mode_deltas(cm->cur_frame->mode_deltas);
  set_default_lf_deltas(&cm->lf);

  av1_default_coef_probs(cm);
  av1_init_mode_probs(cm->fc);
  av1_init_mv_probs(cm);
  cm->fc->initialized = 1;
  av1_setup_frame_contexts(cm);
}